

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O0

LY_ERR lydjson_subtree_r(lyd_json_ctx *lydctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  short sVar1;
  ly_ctx *ctx_00;
  undefined8 uVar2;
  size_t sVar3;
  LYJSON_PARSER_STATUS LVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  ly_err_item *plVar8;
  char *pcVar9;
  ly_err_item *__eitem_3;
  ly_err_item *__eitem_2;
  ly_err_item *__eitem_1;
  ly_err_item *__eitem;
  char *value;
  ly_ctx *ctx;
  lyd_node *attr_node;
  lyd_node *node;
  lysc_ext_instance *ext;
  lysc_node *snode;
  ly_bool parse_subtree;
  size_t sStack_70;
  ly_bool is_meta;
  size_t prefix_len;
  size_t name_len;
  char *expected;
  char *prefix;
  char *name;
  LYJSON_PARSER_STATUS local_40;
  LYJSON_PARSER_STATUS status;
  LY_ERR rc;
  LY_ERR r;
  ly_set *parsed_local;
  lyd_node **first_p_local;
  lyd_node *parent_local;
  lyd_json_ctx *lydctx_local;
  
  local_40 = LYJSON_ERROR;
  _rc = parsed;
  parsed_local = (ly_set *)first_p;
  first_p_local = (lyd_node **)parent;
  parent_local = (lyd_node *)lydctx;
  name._4_4_ = lyjson_ctx_status(lydctx->jsonctx);
  expected = (char *)0x0;
  name_len = 0;
  sStack_70 = 0;
  snode._7_1_ = '\0';
  ext = (lysc_ext_instance *)0x0;
  node = (lyd_node *)0x0;
  attr_node = (lyd_node *)0x0;
  ctx = (ly_ctx *)0x0;
  value = *(char **)&(parent_local[0x4b].parent)->field_0;
  __eitem = (ly_err_item *)0x0;
  if ((first_p_local == (lyd_node **)0x0) && (parsed_local == (ly_set *)0x0)) {
    __assert_fail("parent || first_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x630,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  if ((name._4_4_ != LYJSON_OBJECT) && (name._4_4_ != LYJSON_OBJECT_NEXT)) {
    __assert_fail("(status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x631,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  snode._6_1_ = ((ulong)parent_local->schema & 0x400000) != 0;
  *(uint *)&parent_local->schema = *(uint *)&parent_local->schema & 0xffbfffff;
  status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                           (LYJSON_PARSER_STATUS *)((long)&name + 4));
  LVar4 = status;
  if ((status != LYJSON_ERROR) || (LVar4 = local_40, name._4_4_ == LYJSON_OBJECT_CLOSED))
  goto LAB_0014dd18;
  if (name._4_4_ != LYJSON_OBJECT_NAME) {
    __assert_fail("status == LYJSON_OBJECT_NAME",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_json.c"
                  ,0x63f,
                  "LY_ERR lydjson_subtree_r(struct lyd_json_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                 );
  }
  lydjson_parse_name((char *)((parent_local[0x4b].parent)->field_0).node.prev,
                     (size_t)((parent_local[0x4b].parent)->field_0).node.meta,&prefix,&prefix_len,
                     &expected,&stack0xffffffffffffff90,(ly_bool *)((long)&snode + 7));
  lyjson_ctx_give_dynamic_value((lyjson_ctx *)parent_local[0x4b].parent,(char **)&__eitem);
  if (((((((ulong)parent_local->parent & 0x80) == 0) || (first_p_local != (lyd_node **)0x0)) ||
       (snode._7_1_ != '\0')) || ((prefix_len == 0 || (sStack_70 != 0)))) ||
     (iVar5 = ly_strncmp("eventTime",prefix,prefix_len), iVar5 != 0)) {
    if (((snode._7_1_ == '\0') || (prefix_len != 0)) || (sStack_70 != 0)) {
      status = lydjson_get_snode((lyd_json_ctx *)parent_local,snode._7_1_,expected,sStack_70,prefix,
                                 prefix_len,(lyd_node *)first_p_local,(lysc_node **)&ext,
                                 (lysc_ext_instance **)&node);
      LVar4 = local_40;
      if (status == LYJSON_FALSE) goto LAB_0014dd18;
      if ((status == LYJSON_OBJECT_NAME) && (((ulong)parent_local->schema & 0x400000000) != 0)) {
        local_40 = status;
        status = lydjson_data_skip((lyjson_ctx *)parent_local[0x4b].parent);
        if (status != LYJSON_ERROR) {
          local_40 = status;
        }
        status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                                 (LYJSON_PARSER_STATUS *)((long)&name + 4));
        LVar4 = local_40;
        if (status != LYJSON_ERROR) {
          LVar4 = status;
        }
        goto LAB_0014dd18;
      }
      LVar4 = status;
      if (status != LYJSON_ERROR) goto LAB_0014dd18;
      if (ext == (lysc_ext_instance *)0x0) {
        snode._7_1_ = '\0';
      }
      status = LYJSON_ERROR;
    }
    if (snode._7_1_ != '\0') {
      if (((prefix_len == 0) && (sStack_70 == 0)) && (first_p_local == (lyd_node **)0x0)) {
        ly_vlog((ly_ctx *)value,(char *)0x0,LYVE_SYNTAX_JSON,
                "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries."
               );
        status = LYJSON_OBJECT_NAME;
        local_40 = LYJSON_OBJECT_NAME;
        plVar8 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0);
        LVar4 = local_40;
        if (((status != LYJSON_OBJECT_NAME) || (parent_local == (lyd_node *)0x0)) ||
           ((((ulong)parent_local->schema & 0x400000000) == 0 || (plVar8->vecode == LYVE_SYNTAX))))
        goto LAB_0014dd18;
      }
      else if ((prefix_len == 0) && (sStack_70 == 0)) {
        ctx = (ly_ctx *)first_p_local;
        ext = (lysc_ext_instance *)first_p_local[1];
      }
      status = lydjson_parse_attribute
                         ((lyd_json_ctx *)parent_local,(lyd_node *)ctx,(lysc_node *)ext,prefix,
                          prefix_len,expected,sStack_70,(lyd_node *)first_p_local,
                          (LYJSON_PARSER_STATUS *)((long)&name + 4),(lyd_node **)parsed_local,
                          &attr_node);
      goto joined_r0x0014d7c2;
    }
    if (ext == (lysc_ext_instance *)0x0) {
      if (((ulong)parent_local->schema & 0x40000) == 0) {
        status = lydjson_data_skip((lyjson_ctx *)parent_local[0x4b].parent);
      }
      else {
        if (prefix_len == 0) {
          ly_vlog(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0,(char *)0x0,LYVE_SYNTAX_JSON,
                  "JSON object member name cannot be a zero-length string.");
          status = LYJSON_OBJECT_NAME;
          local_40 = LYJSON_OBJECT_NAME;
          plVar8 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0);
          LVar4 = local_40;
          if ((((status != LYJSON_OBJECT_NAME) || (parent_local == (lyd_node *)0x0)) ||
              (((ulong)parent_local->schema & 0x400000000) == 0)) || (plVar8->vecode == LYVE_SYNTAX)
             ) goto LAB_0014dd18;
        }
        status = lydjson_ctx_next_parse_opaq
                           ((lyd_json_ctx *)parent_local,prefix,prefix_len,expected,sStack_70,
                            (lyd_node *)first_p_local,(LYJSON_PARSER_STATUS *)((long)&name + 4),
                            (lyd_node **)parsed_local,&attr_node);
      }
      goto joined_r0x0014d7c2;
    }
    status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                             (LYJSON_PARSER_STATUS *)((long)&name + 4));
    LVar4 = status;
    if (status != LYJSON_ERROR) goto LAB_0014dd18;
    sVar1 = *(short *)&ext->def;
    if (sVar1 == 1) {
LAB_0014d8c6:
      name_len = (long)"@name/object" + 1;
    }
    else if (sVar1 == 4) {
      if (name._4_4_ == LYJSON_ARRAY) {
        name_len = (size_t)anon_var_dwarf_347f7;
      }
      else {
        name_len = (size_t)anon_var_dwarf_3480e;
      }
    }
    else if (sVar1 == 8) {
      name_len = (size_t)anon_var_dwarf_347d5;
    }
    else if (sVar1 == 0x10) {
      name_len = (size_t)anon_var_dwarf_347ec;
    }
    else if (sVar1 == 0x20) {
      if (name._4_4_ == LYJSON_ARRAY) {
        name_len = (size_t)anon_var_dwarf_34830;
      }
      else {
        name_len = (size_t)anon_var_dwarf_3480e;
      }
    }
    else if (((sVar1 == 0x60) || (sVar1 == 0x100)) || ((sVar1 == 0x200 || (sVar1 == 0x400))))
    goto LAB_0014d8c6;
    sVar1 = *(short *)&ext->def;
    if ((sVar1 == 1) || (sVar1 == 4)) {
LAB_0014daf2:
      status = lydjson_parse_instance
                         ((lyd_json_ctx *)parent_local,(lyd_node *)first_p_local,
                          (lyd_node **)parsed_local,(lysc_node *)ext,(lysc_ext_instance *)node,
                          prefix,prefix_len,expected,sStack_70,
                          (LYJSON_PARSER_STATUS *)((long)&name + 4),&attr_node);
      if (status == LYJSON_FALSE) {
LAB_0014dc61:
        sVar3 = name_len;
        pcVar6 = value;
        pcVar7 = lys_nodetype2str(*(uint16_t *)&ext->def);
        uVar2 = *(undefined8 *)&ext->parent_stmt;
        pcVar9 = lyjson_token2str(name._4_4_);
        ly_vlog((ly_ctx *)pcVar6,(char *)0x0,LYVE_SYNTAX_JSON,
                "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",sVar3,
                pcVar7,uVar2,pcVar9);
        local_40 = LYJSON_OBJECT_NAME;
        LVar4 = local_40;
        if ((((ulong)parent_local->schema & 0x400000000) != 0) &&
           (status = lydjson_data_skip((lyjson_ctx *)parent_local[0x4b].parent), LVar4 = local_40,
           status != LYJSON_ERROR)) {
          LVar4 = status;
        }
        goto LAB_0014dd18;
      }
      if ((status != LYJSON_ERROR) &&
         ((((local_40 = status,
            plVar8 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0),
            LVar4 = local_40, status != LYJSON_OBJECT_NAME || (parent_local == (lyd_node *)0x0)) ||
           (((ulong)parent_local->schema & 0x400000000) == 0)) || (plVar8->vecode == LYVE_SYNTAX))))
      goto LAB_0014dd18;
      if (((ulong)ext->def & 0x700) != 0) {
        parent_local[0x4a].meta = (lyd_meta *)attr_node;
      }
    }
    else if ((sVar1 == 8) || (sVar1 == 0x10)) {
      if (name._4_4_ != LYJSON_ARRAY) goto LAB_0014dc61;
      do {
        status = LYJSON_ERROR;
        status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                                 (LYJSON_PARSER_STATUS *)((long)&name + 4));
        LVar4 = status;
        if (status != LYJSON_ERROR) goto LAB_0014dd18;
        if (name._4_4_ == LYJSON_ARRAY_CLOSED) break;
        status = lydjson_parse_instance
                           ((lyd_json_ctx *)parent_local,(lyd_node *)first_p_local,
                            (lyd_node **)parsed_local,(lysc_node *)ext,(lysc_ext_instance *)node,
                            prefix,prefix_len,expected,sStack_70,
                            (LYJSON_PARSER_STATUS *)((long)&name + 4),&attr_node);
        if (status == LYJSON_FALSE) goto LAB_0014dc61;
        if ((status != LYJSON_ERROR) &&
           ((((local_40 = status,
              plVar8 = ly_err_last(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0),
              LVar4 = local_40, status != LYJSON_OBJECT_NAME || (parent_local == (lyd_node *)0x0))
             || (((ulong)parent_local->schema & 0x400000000) == 0)) ||
            (plVar8->vecode == LYVE_SYNTAX)))) goto LAB_0014dd18;
        lydjson_maintain_children
                  ((lyd_node *)first_p_local,(lyd_node **)parsed_local,&attr_node,
                   ((ulong)parent_local->schema & 0x200000) != 0,(lysc_ext_instance *)node);
        status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                                 (LYJSON_PARSER_STATUS *)((long)&name + 4));
        LVar4 = status;
        if (status != LYJSON_ERROR) goto LAB_0014dd18;
      } while (name._4_4_ == LYJSON_ARRAY_NEXT);
    }
    else if (((sVar1 == 0x20) || (sVar1 == 0x60)) ||
            ((sVar1 == 0x100 || ((sVar1 == 0x200 || (sVar1 == 0x400)))))) goto LAB_0014daf2;
  }
  else {
    status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                             (LYJSON_PARSER_STATUS *)((long)&name + 4));
    LVar4 = status;
    if (status != LYJSON_ERROR) goto LAB_0014dd18;
    if (name._4_4_ != LYJSON_STRING) {
      ctx_00 = *(ly_ctx **)&(parent_local[0x4b].parent)->field_0;
      pcVar6 = lyjson_token2str(LYJSON_STRING);
      pcVar7 = lyjson_token2str(name._4_4_);
      ly_vlog(ctx_00,(char *)0x0,LYVE_SYNTAX_JSON,"Expecting JSON %s but %s found.",pcVar6,pcVar7);
      local_40 = LYJSON_OBJECT_NAME;
      LVar4 = local_40;
      goto LAB_0014dd18;
    }
    status = lyd_create_opaq(*(ly_ctx **)&(parent_local[0x4b].parent)->field_0,prefix,prefix_len,
                             expected,sStack_70,expected,sStack_70,
                             (char *)((parent_local[0x4b].parent)->field_0).node.prev,
                             (size_t)((parent_local[0x4b].parent)->field_0).node.meta,(ly_bool *)0x0
                             ,LY_VALUE_JSON,(void *)0x0,1,&attr_node);
    LVar4 = status;
    if (status != LYJSON_ERROR) goto LAB_0014dd18;
    status = lyd_parser_notif_eventtime_validate(attr_node);
joined_r0x0014d7c2:
    LVar4 = status;
    if (status != LYJSON_ERROR) goto LAB_0014dd18;
  }
  if ((_rc != (ly_set *)0x0) && (attr_node != (lyd_node *)0x0)) {
    ly_set_add(_rc,attr_node,'\x01',(uint32_t *)0x0);
  }
  lydjson_maintain_children
            ((lyd_node *)first_p_local,(lyd_node **)parsed_local,&attr_node,
             ((ulong)parent_local->schema & 0x200000) != 0,(lysc_ext_instance *)node);
  if ((snode._6_1_ != '\0') ||
     (status = lyjson_ctx_next((lyjson_ctx *)parent_local[0x4b].parent,
                               (LYJSON_PARSER_STATUS *)((long)&name + 4)), LVar4 = status,
     status == LYJSON_ERROR)) {
    LVar4 = local_40;
  }
LAB_0014dd18:
  local_40 = LVar4;
  free(__eitem);
  lyd_free_tree(attr_node);
  return local_40;
}

Assistant:

static LY_ERR
lydjson_subtree_r(struct lyd_json_ctx *lydctx, struct lyd_node *parent, struct lyd_node **first_p, struct ly_set *parsed)
{
    LY_ERR r, rc = LY_SUCCESS;
    enum LYJSON_PARSER_STATUS status = lyjson_ctx_status(lydctx->jsonctx);
    const char *name, *prefix = NULL, *expected = NULL;
    size_t name_len, prefix_len = 0;
    ly_bool is_meta = 0, parse_subtree;
    const struct lysc_node *snode = NULL;
    struct lysc_ext_instance *ext = NULL;
    struct lyd_node *node = NULL, *attr_node = NULL;
    const struct ly_ctx *ctx = lydctx->jsonctx->ctx;
    char *value = NULL;

    assert(parent || first_p);
    assert((status == LYJSON_OBJECT) || (status == LYJSON_OBJECT_NEXT));

    parse_subtree = lydctx->parse_opts & LYD_PARSE_SUBTREE ? 1 : 0;
    /* all descendants should be parsed */
    lydctx->parse_opts &= ~LYD_PARSE_SUBTREE;

    r = lyjson_ctx_next(lydctx->jsonctx, &status);
    LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    if (status == LYJSON_OBJECT_CLOSED) {
        /* empty object, fine... */
        goto cleanup;
    }

    /* process the node name */
    assert(status == LYJSON_OBJECT_NAME);
    lydjson_parse_name(lydctx->jsonctx->value, lydctx->jsonctx->value_len, &name, &name_len, &prefix, &prefix_len, &is_meta);
    lyjson_ctx_give_dynamic_value(lydctx->jsonctx, &value);

    if ((lydctx->int_opts & LYD_INTOPT_EVENTTIME) && !parent && !is_meta && name_len && !prefix_len &&
            !ly_strncmp("eventTime", name, name_len)) {
        /* parse eventTime */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        if (status != LYJSON_STRING) {
            LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s found.", lyjson_token2str(LYJSON_STRING),
                    lyjson_token2str(status));
            rc = LY_EVALID;
            goto cleanup;
        }

        /* create node */
        r = lyd_create_opaq(lydctx->jsonctx->ctx, name, name_len, prefix, prefix_len, prefix, prefix_len,
                lydctx->jsonctx->value, lydctx->jsonctx->value_len, NULL, LY_VALUE_JSON, NULL, LYD_VALHINT_STRING, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* validate the value */
        r = lyd_parser_notif_eventtime_validate(node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        goto node_parsed;
    } else if (!is_meta || name_len || prefix_len) {
        /* get the schema node */
        r = lydjson_get_snode(lydctx, is_meta, prefix, prefix_len, name, name_len, parent, &snode, &ext);
        if (r == LY_ENOT) {
            /* data parsed */
            goto cleanup;
        } else if ((r == LY_EVALID) && (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR)) {
            rc = r;

            /* skip the invalid data */
            if ((r = lydjson_data_skip(lydctx->jsonctx))) {
                rc = r;
            }
            r = lyjson_ctx_next(lydctx->jsonctx, &status);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            goto cleanup;
        } else if (r) {
            /* error */
            rc = r;
            goto cleanup;
        }

        if (!snode) {
            /* we will not be parsing it as metadata */
            is_meta = 0;
        }
    }

    if (is_meta) {
        /* parse as metadata */
        if (!name_len && !prefix_len && !parent) {
            LOGVAL(ctx, LYVE_SYNTAX_JSON,
                    "Invalid metadata format - \"@\" can be used only inside anydata, container or list entries.");
            r = LY_EVALID;
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
        } else if (!name_len && !prefix_len) {
            /* parent's metadata without a name - use the schema from the parent */
            attr_node = parent;
            snode = attr_node->schema;
        }
        r = lydjson_parse_attribute(lydctx, attr_node, snode, name, name_len, prefix, prefix_len, parent, &status,
                first_p, &node);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    } else if (!snode) {
        if (!(lydctx->parse_opts & LYD_PARSE_OPAQ)) {
            /* skip element with children */
            r = lydjson_data_skip(lydctx->jsonctx);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        } else {
            /* parse as an opaq node */

            /* opaq node cannot have an empty string as the name. */
            if (name_len == 0) {
                LOGVAL(lydctx->jsonctx->ctx, LYVE_SYNTAX_JSON, "JSON object member name cannot be a zero-length string.");
                r = LY_EVALID;
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);
            }

            /* move to the second item in the name/X pair and parse opaq */
            r = lydjson_ctx_next_parse_opaq(lydctx, name, name_len, prefix, prefix_len, parent, &status, first_p, &node);
            LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
        }
    } else {
        /* parse as a standard lyd_node but it can still turn out to be an opaque node */

        /* move to the second item in the name/X pair */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);

        /* set expected representation */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
            expected = "name/array of values";
            break;
        case LYS_LIST:
            expected = "name/array of objects";
            break;
        case LYS_LEAF:
            if (status == LYJSON_ARRAY) {
                expected = "name/[null]";
            } else {
                expected = "name/value";
            }
            break;
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
            expected = "name/object";
            break;
        case LYS_ANYXML:
            if (status == LYJSON_ARRAY) {
                expected = "name/array";
            } else {
                expected = "name/value";
            }
            break;
        }

        /* check the representation according to the nodetype and then continue with the content */
        switch (snode->nodetype) {
        case LYS_LEAFLIST:
        case LYS_LIST:
            LY_CHECK_GOTO(status != LYJSON_ARRAY, representation_error);

            /* process all the values/objects */
            do {
                /* move into array/next value */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
                if (status == LYJSON_ARRAY_CLOSED) {
                    /* empty array, fine... */
                    break;
                }

                r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                        &status, &node);
                if (r == LY_ENOT) {
                    goto representation_error;
                }
                LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

                lydjson_maintain_children(parent, first_p, &node,
                        lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

                /* move after the item(s) */
                r = lyjson_ctx_next(lydctx->jsonctx, &status);
                LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
            } while (status == LYJSON_ARRAY_NEXT);

            break;
        case LYS_LEAF:
        case LYS_CONTAINER:
        case LYS_NOTIF:
        case LYS_ACTION:
        case LYS_RPC:
        case LYS_ANYDATA:
        case LYS_ANYXML:
            /* process the value/object */
            r = lydjson_parse_instance(lydctx, parent, first_p, snode, ext, name, name_len, prefix, prefix_len,
                    &status, &node);
            if (r == LY_ENOT) {
                goto representation_error;
            }
            LY_DPARSER_ERR_GOTO(r, rc = r, lydctx, cleanup);

            if (snode->nodetype & (LYS_RPC | LYS_ACTION | LYS_NOTIF)) {
                /* rememeber the RPC/action/notification */
                lydctx->op_node = node;
            }
            break;
        }
    }

node_parsed:
    /* rememeber a successfully parsed node */
    if (parsed && node) {
        ly_set_add(parsed, node, 1, NULL);
    }

    /* finally connect the parsed node, is zeroed */
    lydjson_maintain_children(parent, first_p, &node,
            lydctx->parse_opts & LYD_PARSE_ORDERED ? LYD_INSERT_NODE_LAST : LYD_INSERT_NODE_DEFAULT, ext);

    if (!parse_subtree) {
        /* move after the item(s) */
        r = lyjson_ctx_next(lydctx->jsonctx, &status);
        LY_CHECK_ERR_GOTO(r, rc = r, cleanup);
    }

    /* success */
    goto cleanup;

representation_error:
    LOGVAL(ctx, LYVE_SYNTAX_JSON, "Expecting JSON %s but %s \"%s\" is represented in input data as name/%s.",
            expected, lys_nodetype2str(snode->nodetype), snode->name, lyjson_token2str(status));
    rc = LY_EVALID;
    if (lydctx->val_opts & LYD_VALIDATE_MULTI_ERROR) {
        /* try to skip the invalid data */
        if ((r = lydjson_data_skip(lydctx->jsonctx))) {
            rc = r;
        }
    }

cleanup:
    free(value);
    lyd_free_tree(node);
    return rc;
}